

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

aiQuaternion __thiscall
comparer_context::cmp<aiQuaterniont<float>>(comparer_context *this,string *name)

{
  float fVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  float local_ac;
  undefined1 local_a8 [4];
  float z;
  float local_84;
  undefined1 local_80 [4];
  float y;
  float local_60;
  float x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  float local_2c;
  string *psStack_28;
  float w;
  string *name_local;
  comparer_context *this_local;
  
  psStack_28 = name;
  name_local = (string *)this;
  std::operator+(&local_50,name,".w");
  fVar1 = cmp<float>(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_2c = fVar1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 psStack_28,".x");
  fVar1 = cmp<float>(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80);
  std::__cxx11::string::~string((string *)local_80);
  local_60 = fVar1;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 psStack_28,".y");
  fVar1 = cmp<float>(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  local_84 = fVar1;
  std::operator+(&local_d0,psStack_28,".z");
  fVar1 = cmp<float>(this,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  local_ac = fVar1;
  aiQuaterniont<float>::aiQuaterniont
            ((aiQuaterniont<float> *)&this_local,local_2c,local_60,local_84,fVar1);
  return _this_local;
}

Assistant:

aiQuaternion comparer_context :: cmp<aiQuaternion >(const std::string& name)
{
    const float w = cmp<float>(name+".w");
    const float x = cmp<float>(name+".x");
    const float y = cmp<float>(name+".y");
    const float z = cmp<float>(name+".z");

    return aiQuaternion(w,x,y,z);
}